

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

void helicsDataBufferToVector(HelicsDataBuffer data,double *values,int maxlen,int *actualSize)

{
  pointer pdVar1;
  DataType baseType;
  int iVar2;
  Message *pMVar3;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> local_58;
  data_view local_40;
  
  if (values != (double *)0x0 && 0 < maxlen) {
    if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
      pMVar3 = getMessageObj(data,(HelicsError *)0x0);
      data = &pMVar3->data;
      if (pMVar3 == (Message *)0x0) {
        data = (SmallBuffer *)0x0;
      }
    }
    if ((SmallBuffer *)data != (SmallBuffer *)0x0) {
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_40.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
      local_40.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
      local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      baseType = helics::detail::detectType((byte *)local_40.dblock._M_str);
      helics::valueExtract(&local_40,baseType,&local_58);
      if (local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.ref.
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pdVar1 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = (int)((ulong)((long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar2 < maxlen) {
        maxlen = iVar2;
      }
      memcpy(values,local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(long)maxlen << 3);
      if (actualSize != (int *)0x0) {
        *actualSize = maxlen;
      }
      if (pdVar1 == (pointer)0x0) {
        return;
      }
      operator_delete(pdVar1,(long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1)
      ;
      return;
    }
  }
  if (actualSize != (int *)0x0) {
    *actualSize = 0;
  }
  return;
}

Assistant:

void helicsDataBufferToVector(HelicsDataBuffer data, double values[], int maxlen, int* actualSize)
{
    if ((values == nullptr) || (maxlen <= 0)) {
        if (actualSize != nullptr) {
            *actualSize = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualSize != nullptr) {
            *actualSize = 0;
        }
        return;
    }

    std::vector<double> v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxlen);
    std::memcpy(values, v.data(), length * sizeof(double));
    if (actualSize != nullptr) {
        *actualSize = length;
    }
}